

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O3

int __thiscall
IsoWriter::writeExtendedFileEntryDescriptor
          (IsoWriter *this,bool namedStream,uint8_t objectId,FileTypes fileType,uint64_t len,
          uint32_t pos,uint16_t linkCount,ExtentList *extents)

{
  uint8_t *buffer;
  int64_t iVar1;
  uint16_t len_00;
  uint16_t *buff16_1;
  uint64_t uVar2;
  uint8_t *puVar3;
  ssize_t sVar4;
  uint uVar5;
  size_t __n_00;
  undefined7 in_register_00000011;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  uint32_t *buff32;
  bool bVar11;
  uint64_t local_48;
  undefined4 local_3c;
  uint64_t local_38;
  pointer __n;
  
  local_3c = (undefined4)CONCAT71(in_register_00000011,objectId);
  buffer = this->m_buffer;
  local_48 = len;
  memset(buffer,0,0x800);
  uVar10 = (this->m_file).m_pos;
  iVar7 = this->m_tagLocationBaseAddr;
  this->m_buffer[0] = '\n';
  this->m_buffer[1] = '\x01';
  this->m_buffer[2] = '\x03';
  this->m_buffer[3] = '\0';
  this->m_buffer[6] = '\x01';
  this->m_buffer[7] = '\0';
  *(int *)(this->m_buffer + 0xc) = (int)(uVar10 >> 0xb) - iVar7;
  this->m_buffer[0x14] = '\x04';
  this->m_buffer[0x15] = '\0';
  this->m_buffer[0x18] = '\x01';
  this->m_buffer[0x19] = '\0';
  this->m_buffer[0x1b] = (uint8_t)fileType;
  if ((fileType == RealtimeFile) || (fileType == File)) {
    *(ushort *)(this->m_buffer + 0x22) = (ushort)namedStream << 0xd | 0x21;
    this->m_buffer[0x24] = 0xff;
    this->m_buffer[0x25] = 0xff;
    this->m_buffer[0x26] = 0xff;
    this->m_buffer[0x27] = 0xff;
    this->m_buffer[0x28] = 0xff;
    this->m_buffer[0x29] = 0xff;
    this->m_buffer[0x2a] = 0xff;
    this->m_buffer[0x2b] = 0xff;
  }
  else {
    *(ushort *)(this->m_buffer + 0x22) = (ushort)namedStream << 0xd | 0x20;
    this->m_buffer[0x24] = 0xff;
    this->m_buffer[0x25] = 0xff;
    this->m_buffer[0x26] = 0xff;
    this->m_buffer[0x27] = 0xff;
    this->m_buffer[0x28] = 0xff;
    this->m_buffer[0x29] = 0xff;
    this->m_buffer[0x2a] = 0xff;
    this->m_buffer[0x2b] = 0xff;
    if (0xf9 < (int)fileType) {
      if (linkCount != 0) {
        __assert_fail("linkCount == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/iso_writer.cpp"
                      ,0x3f8,
                      "int IsoWriter::writeExtendedFileEntryDescriptor(const bool, const uint8_t, const FileTypes, const uint64_t, const uint32_t, const uint16_t, const ExtentList *)"
                     );
      }
      goto LAB_0018e2f1;
    }
  }
  if ((fileType == RealtimeFile) || (fileType == File)) {
    this->m_buffer[0x2c] = 0x84;
    this->m_buffer[0x2d] = '\x10';
    this->m_buffer[0x2e] = '\0';
    this->m_buffer[0x2f] = '\0';
    bVar11 = linkCount != 1;
    linkCount = 1;
    if (bVar11) {
      __assert_fail("linkCount == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/iso_writer.cpp"
                    ,0x3fe,
                    "int IsoWriter::writeExtendedFileEntryDescriptor(const bool, const uint8_t, const FileTypes, const uint64_t, const uint32_t, const uint16_t, const ExtentList *)"
                   );
    }
  }
  else {
    this->m_buffer[0x2c] = 0xa5;
    this->m_buffer[0x2d] = '\x14';
    this->m_buffer[0x2e] = '\0';
    this->m_buffer[0x2f] = '\0';
  }
  *(uint16_t *)(this->m_buffer + 0x30) = linkCount;
LAB_0018e2f1:
  this->m_buffer[0x32] = '\0';
  this->m_buffer[0x33] = '\0';
  this->m_buffer[0x34] = '\0';
  this->m_buffer[0x35] = '\0';
  this->m_buffer[0x36] = '\0';
  this->m_buffer[0x37] = '\0';
  *(uint64_t *)(this->m_buffer + 0x38) = len;
  *(uint64_t *)(this->m_buffer + 0x40) = len;
  local_38 = 0x800;
  uVar2 = roundUp64(&local_48,&local_38);
  *(int *)(this->m_buffer + 0x48) = (int)(uVar2 >> 0xb);
  this->m_buffer[0x4c] = '\0';
  this->m_buffer[0x4d] = '\0';
  this->m_buffer[0x4e] = '\0';
  this->m_buffer[0x4f] = '\0';
  anon_unknown.dwarf_1250c1::writeTimestamp(this->m_buffer + 0x50,this->m_currentTime);
  anon_unknown.dwarf_1250c1::writeTimestamp(this->m_buffer + 0x5c,this->m_currentTime);
  anon_unknown.dwarf_1250c1::writeTimestamp(this->m_buffer + 0x68,this->m_currentTime);
  anon_unknown.dwarf_1250c1::writeTimestamp(this->m_buffer + 0x74,this->m_currentTime);
  this->m_buffer[0x80] = '\x01';
  this->m_buffer[0x81] = '\0';
  this->m_buffer[0x82] = '\0';
  this->m_buffer[0x83] = '\0';
  strcpy((char *)(this->m_buffer + 0xa9),(this->m_impId)._M_dataplus._M_p);
  this->m_buffer[200] = (uint8_t)local_3c;
  if ((fileType == File) || (fileType == RealtimeFile)) {
    if (extents != (ExtentList *)0x0) {
      __n = (extents->super__Vector_base<Extent,_std::allocator<Extent>_>)._M_impl.
            super__Vector_impl_data._M_start;
      uVar6 = (long)(extents->super__Vector_base<Extent,_std::allocator<Extent>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)__n >> 4;
      uVar10 = 0x70;
      if (uVar6 < 0x70) {
        uVar10 = uVar6;
      }
      uVar10 = (uVar6 - uVar10 == 1) + uVar10;
      *(int *)(this->m_buffer + 0xd4) = (int)uVar10 << 4;
      puVar3 = this->m_buffer + 0xd8;
      if (uVar10 != 0) {
        __n = (pointer)&__n->size;
        uVar8 = 0;
        do {
          if (uVar6 == uVar8) {
            pcVar9 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
            sVar4 = File::write((File *)(pcVar9 + 0x68),(int)uVar6,(void *)0x800,(size_t)__n);
            return (int)sVar4;
          }
          iVar1 = __n[-1].size;
          *(int *)puVar3 = __n->lbnPos;
          *(int *)(puVar3 + 4) = (int)iVar1;
          puVar3[8] = '\0';
          puVar3[9] = '\0';
          puVar3[0xc] = '\0';
          puVar3[0xd] = '\0';
          puVar3[0xe] = '\0';
          puVar3[0xf] = '\0';
          puVar3 = puVar3 + 0x10;
          uVar8 = uVar8 + 1;
          __n = __n + 1;
        } while (uVar10 != uVar8);
      }
      if (uVar10 < uVar6) {
        *(int *)(this->m_buffer + 0xd4) = *(int *)(this->m_buffer + 0xd4) + 0x10;
        uVar5 = ((int)((ulong)(this->m_file).m_pos >> 0xb) - this->m_tagLocationBaseAddr) + 1;
        __n = (pointer)(ulong)uVar5;
        puVar3[0] = '\0';
        puVar3[1] = '\b';
        puVar3[2] = '\0';
        puVar3[3] = 0xc0;
        *(uint *)(puVar3 + 4) = uVar5;
        puVar3[8] = '\x01';
        puVar3[9] = '\0';
        puVar3[0xc] = '\0';
        puVar3[0xd] = '\0';
        puVar3[0xe] = '\0';
        puVar3[0xf] = '\0';
        puVar3 = puVar3 + 0x10;
      }
      anon_unknown.dwarf_1250c1::calcDescriptorCRC(buffer,(short)puVar3 - (short)buffer);
      File::write(&this->m_file,(int)buffer,(void *)0x800,(size_t)__n);
      uVar6 = (long)(extents->super__Vector_base<Extent,_std::allocator<Extent>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(extents->super__Vector_base<Extent,_std::allocator<Extent>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 4;
      iVar7 = 1;
      if (uVar6 <= uVar10) {
        return 1;
      }
      do {
        uVar8 = uVar10 + 0x7c;
        if (uVar6 <= uVar10 + 0x7c) {
          uVar8 = uVar6;
        }
        uVar8 = (uVar6 - uVar8 == 1) + uVar8;
        writeAllocationExtentDescriptor(this,extents,uVar10,uVar8);
        iVar7 = iVar7 + 1;
        uVar6 = (long)(extents->super__Vector_base<Extent,_std::allocator<Extent>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(extents->super__Vector_base<Extent,_std::allocator<Extent>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 4;
        uVar10 = uVar8;
      } while (uVar8 < uVar6);
      return iVar7;
    }
    this->m_buffer[0xd4] = '\x10';
    this->m_buffer[0xd5] = '\0';
    this->m_buffer[0xd6] = '\0';
    this->m_buffer[0xd7] = '\0';
    *(undefined4 *)(this->m_buffer + 0xd8) = (undefined4)local_48;
    *(uint32_t *)(this->m_buffer + 0xdc) = pos;
    this->m_buffer[0xe0] = '\0';
    this->m_buffer[0xe1] = '\0';
    len_00 = 0xe8;
    pos = 0;
    __n_00 = 0x184;
  }
  else {
    this->m_buffer[0xd4] = '\b';
    this->m_buffer[0xd5] = '\0';
    this->m_buffer[0xd6] = '\0';
    this->m_buffer[0xd7] = '\0';
    *(undefined4 *)(this->m_buffer + 0xd8) = (undefined4)local_48;
    len_00 = 0xe0;
    __n_00 = 0x17c;
  }
  *(uint32_t *)((long)&(this->m_volumeLabel)._M_dataplus._M_p + __n_00) = pos;
  anon_unknown.dwarf_1250c1::calcDescriptorCRC(buffer,len_00);
  File::write(&this->m_file,(int)buffer,(void *)0x800,__n_00);
  return 1;
}

Assistant:

int IsoWriter::writeExtendedFileEntryDescriptor(const bool namedStream, const uint8_t objectId,
                                                const FileTypes fileType, const uint64_t len, const uint32_t pos,
                                                const uint16_t linkCount, const ExtentList *extents)
{
    int sectorsWrited = 0;

    memset(m_buffer, 0, sizeof(m_buffer));
    writeDescriptorTag(m_buffer, DescriptorTag::ExtendedFileEntry, absoluteSectorNum());

    const auto buff32 = reinterpret_cast<uint32_t *>(m_buffer);
    const auto buff16 = reinterpret_cast<uint16_t *>(m_buffer);
    const auto buff64 = reinterpret_cast<uint64_t *>(m_buffer);

    writeIcbTag(namedStream, m_buffer + 16, fileType);

    buff32[36 / 4] = UINT_MAX;  // uid
    buff32[40 / 4] = UINT_MAX;  // guid
    // zero Permissions, File Link Count, Record Format, Record Display Attributes
    if (fileType >= FileTypes::Metadata)
    {
        buff32[44 / 4] = 0x000000;  // Permissions
        assert(linkCount == 0);
        buff16[48 / 2] = linkCount;  // File Link Count
    }
    else if (fileType == FileTypes::File || fileType == FileTypes::RealtimeFile)
    {
        buff32[44 / 4] = 0x1084;  // Permissions
        assert(linkCount == 1);
        buff16[48 / 2] = linkCount;  // File Link Count
    }
    else
    {
        buff32[44 / 4] = 0x14A5;     // Permissions
        buff16[48 / 2] = linkCount;  // File Link Count
    }

    m_buffer[50] = 0x0;  // Record Format
    m_buffer[51] = 0x0;  // Record Display Attributes

    buff32[52 / 4] = 0x00;  // Record Length
    buff64[56 / 8] = len;   // Information Length
    buff64[64 / 8] = len;   // Object Size

    buff32[72 / 4] =
        static_cast<uint32_t>(roundUp64(len, SECTOR_SIZE) / SECTOR_SIZE);  // blocks recorded (matched to bytes)
    buff32[76 / 4] = 0x00;                                                 // high part of blocks recorded

    writeTimestamp(m_buffer + 80, m_currentTime);   // access datetime
    writeTimestamp(m_buffer + 92, m_currentTime);   // modification datetime
    writeTimestamp(m_buffer + 104, m_currentTime);  // creation datetime
    writeTimestamp(m_buffer + 116, m_currentTime);  // attributes datetime
    buff32[128 / 4] = 0x01;                         // Checkpoint
    // skip Extended Attribute ICB
    // skip Stream Directory ICB

    strcpy(reinterpret_cast<char *>(m_buffer) + 169, m_impId.c_str());  // Implementation Identifier
    m_buffer[200] = objectId;                                           // Unique ID

    // skip Length of Extended Attributes
    if (fileType != FileTypes::File && fileType != FileTypes::RealtimeFile)
    {
        // metadata object (metadata file, directory e.t.c). Using short extent
        buff32[212 / 4] = 0x08;                        // Length of Allocation Descriptors
        buff32[216 / 4] = static_cast<uint32_t>(len);  // Allocation descriptors, data len in bytes
        buff32[220 / 4] = pos;  // Allocation descriptors, start logical block number inside volume
        calcDescriptorCRC(m_buffer, 224);
        m_file.write(m_buffer, SECTOR_SIZE);
        sectorsWrited++;
    }
    else if (extents == nullptr)
    {
        // file object. using long AD
        buff32[212 / 4] = 0x10;  // long AD size
        writeLongAD(m_buffer + 216, static_cast<uint32_t>(len), pos, 0, 0);
        calcDescriptorCRC(m_buffer, 232);
        m_file.write(m_buffer, SECTOR_SIZE);
        sectorsWrited++;
    }
    else
    {
        size_t indexEnd = FFMIN(MAX_EXTENTS_IN_EXTFILE, extents->size());
        if (extents->size() - indexEnd == 1)
            indexEnd++;  // continue record may be replaced by payload data
        buff32[212 / 4] = static_cast<uint32_t>(0x10 * indexEnd);
        uint8_t *curPos = m_buffer + 216;
        for (size_t i = 0; i < indexEnd; ++i)
        {
            writeLongAD(curPos, static_cast<uint32_t>(extents->at(i).size), extents->at(i).lbnPos, 0, 0);
            curPos += 16;
        }
        if (indexEnd < extents->size())
        {
            buff32[212 / 4] += 0x10;
            writeLongAD(curPos, SECTOR_SIZE + NEXT_EXTENT, absoluteSectorNum() + 1, 1, 0);  // continue expected
            curPos += 16;
        }
        calcDescriptorCRC(m_buffer, static_cast<uint16_t>(curPos - m_buffer));
        m_file.write(m_buffer, SECTOR_SIZE);
        sectorsWrited++;

        size_t indexStart = indexEnd;
        while (indexStart < extents->size())
        {
            indexEnd = FFMIN(indexStart + MAX_EXTENTS_IN_EXTCONT, extents->size());
            if (extents->size() - indexEnd == 1)
                indexEnd++;  // continue record may be replaced by payload data
            writeAllocationExtentDescriptor(extents, indexStart, indexEnd);
            sectorsWrited++;
            indexStart = indexEnd;
        }
    }

    return sectorsWrited;
}